

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool util::compareString(char *str1,char *str2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int local_24;
  int i;
  char *str2_local;
  char *str1_local;
  
  sVar3 = strlen(str1);
  sVar4 = strlen(str2);
  if (sVar3 == sVar4) {
    for (local_24 = 0; sVar3 = strlen(str1), (ulong)(long)local_24 < sVar3; local_24 = local_24 + 1)
    {
      iVar1 = tolower((int)str1[local_24]);
      iVar2 = tolower((int)str2[local_24]);
      if (iVar1 != iVar2) {
        return false;
      }
    }
    str1_local._7_1_ = true;
  }
  else {
    str1_local._7_1_ = false;
  }
  return str1_local._7_1_;
}

Assistant:

bool util::compareString(const char* str1, const char* str2){
    if(strlen(str1) != strlen(str2))
        return false;
    for(int i = 0; i < strlen(str1); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}